

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

void __thiscall PDA::Transducer::Tokenizer::printTokens(Tokenizer *this)

{
  long *plVar1;
  pointer pTVar2;
  int iVar3;
  undefined8 in_RAX;
  wostream *pwVar4;
  Token *token;
  pointer pTVar5;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  pwVar4 = std::operator<<((wostream *)&std::wcout,"================LEX TABLE=====================")
  ;
  plVar1 = *(long **)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0xf0);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x50))(plVar1,10);
    std::wostream::put((wchar_t)pwVar4);
    std::wostream::flush();
    pTVar5 = (this->m_tokens).
             super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (this->m_tokens).
             super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar5 != pTVar2) {
      iVar3 = 1;
      do {
        if (pTVar5->line != iVar3) {
          plVar1 = *(long **)(std::__cxx11::wstring::operator= + *(long *)(std::wcout + -0x18));
          if (plVar1 == (long *)0x0) goto LAB_001085c5;
          (**(code **)(*plVar1 + 0x50))(plVar1,10);
          std::wostream::put(L'\x00150230');
          std::wostream::flush();
        }
        uStack_28 = CONCAT44(pTVar5->token,(undefined4)uStack_28);
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                  ((wostream *)&std::wcout,(wchar_t *)((long)&uStack_28 + 4),1);
        iVar3 = pTVar5->line;
        pTVar5 = pTVar5 + 1;
      } while (pTVar5 != pTVar2);
    }
    plVar1 = *(long **)(std::__cxx11::wstring::operator= + *(long *)(std::wcout + -0x18));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x50))(plVar1,10);
      std::wostream::put(L'\x00150230');
      std::wostream::flush();
      pwVar4 = std::operator<<((wostream *)&std::wcout,
                               "=============================================");
      plVar1 = *(long **)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0xf0);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x50))(plVar1,10);
        std::wostream::put((wchar_t)pwVar4);
        std::wostream::flush();
        return;
      }
    }
  }
LAB_001085c5:
  std::__throw_bad_cast();
}

Assistant:

void Tokenizer::printTokens() const
{
    std::wcout << "================LEX TABLE=====================" << std::endl;
    int lastLine(1);
    for(const Token &token : m_tokens)
    {
        if (token.line != lastLine)
            std::wcout << std::endl;
        std::wcout << token.token;
        lastLine = token.line;
    }
    std::wcout << std::endl;
    std::wcout << "=============================================" << std::endl;
}